

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

void __thiscall
chaiscript::exception::arithmetic_error::arithmetic_error(arithmetic_error *this,string *reason)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Arithmetic error: ",reason);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_004822f8;
  return;
}

Assistant:

explicit arithmetic_error(const std::string &reason)
        : std::runtime_error("Arithmetic error: " + reason) {
    }